

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_core.cpp
# Opt level: O3

void r_exec::delegatedCoreWait(TimeJob *job)

{
  thread *ptVar1;
  int iVar2;
  State SVar3;
  int iVar4;
  _Mem *p_Var5;
  long lVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  timespec local_40;
  
  p_Var5 = (_Mem *)r_code::Mem::Get();
  _Mem::start_core(p_Var5);
  do {
    if (job->target_time != 0) {
      lVar6 = job->target_time - (long)delegatedCoreWait::last_lag.super___atomic_base<long>._M_i;
      lVar10 = lVar6 * 1000;
LAB_00151f18:
      lVar7 = std::chrono::_V2::system_clock::now();
      if (SBORROW8(lVar7,lVar10) != lVar7 + lVar6 * -1000 < 0) {
        uVar9 = lVar10 - lVar7;
        if (uVar9 != 0 && lVar7 <= lVar10) {
          local_40.tv_sec = uVar9 / 1000000000;
          local_40.tv_nsec = uVar9 % 1000000000;
          do {
            iVar2 = nanosleep(&local_40,&local_40);
            if (iVar2 != -1) break;
            piVar8 = __errno_location();
          } while (*piVar8 == 4);
        }
        goto LAB_00151f18;
      }
    }
    iVar2 = (*(job->super__Object)._vptr__Object[3])(job);
    if ((char)iVar2 == '\0') {
LAB_00151ffe:
      ptVar1 = job->thread;
      if ((ptVar1 != (thread *)0x0) && ((ptVar1->_M_id)._M_thread != 0)) {
        std::terminate();
      }
      operator_delete(ptVar1);
      (*(job->super__Object)._vptr__Object[1])(job);
      p_Var5 = (_Mem *)r_code::Mem::Get();
      _Mem::shutdown_core(p_Var5);
      return;
    }
    p_Var5 = (_Mem *)r_code::Mem::Get();
    SVar3 = _Mem::check_state(p_Var5);
    if (SVar3 != RUNNING) goto LAB_00151ffe;
    if (job->target_time == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (*Now)();
      lVar6 = lVar6 - job->target_time;
    }
    iVar2 = (*(job->super__Object)._vptr__Object[2])(job);
    (*(job->super__Object)._vptr__Object[5])(job,lVar6);
    delegatedCoreWait::last_lag.super___atomic_base<long>._M_i =
         (__atomic_base<long>)
         (long)((double)(long)delegatedCoreWait::last_lag.super___atomic_base<long>._M_i *
                0.8999999985098839 + (double)((float)lVar6 * 0.1));
    LOCK();
    UNLOCK();
    iVar4 = (*(job->super__Object)._vptr__Object[4])(job);
    if (((char)iVar2 == '\0') || ((char)iVar4 == '\0')) goto LAB_00151ffe;
  } while( true );
}

Assistant:

void delegatedCoreWait(TimeJob *job)
{
    _Mem::Get()->start_core();
    bool run = true;

    static std::atomic_int64_t last_lag;

    static constexpr float smoothing_factor = 0.1;

    do {
        if (job->target_time > 0) {
            std::this_thread::sleep_until(high_resolution_clock::time_point(microseconds(job->target_time - last_lag)));
        }

        if (R_UNLIKELY(!job->is_alive())) {
            break;
        }

        if (R_UNLIKELY(_Mem::Get()->check_state() != _Mem::RUNNING)) {
            break;
        }

        int64_t lag = job->target_time ? Now() - job->target_time : 0;
        run = job->update();

        job->report(lag);

        last_lag = smoothing_factor * lag + (1.0 - smoothing_factor) * last_lag;
    } while(job->shouldRunAgain() && run);

    delete job->thread;
    delete job;
    _Mem::Get()->shutdown_core();
}